

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::ColumnChunk::ColumnChunk(ColumnChunk *this)

{
  _EncryptionWithColumnKey__isset *p_Var1;
  _ColumnCryptoMetaData__isset *p_Var2;
  
  *(undefined ***)this = &PTR__ColumnChunk_0247d938;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  this->file_offset = 0;
  ColumnMetaData::ColumnMetaData(&this->meta_data);
  this->offset_index_offset = 0;
  this->offset_index_length = 0;
  this->column_index_offset = 0;
  this->column_index_length = 0;
  *(undefined ***)&this->crypto_metadata = &PTR__ColumnCryptoMetaData_0247d8d0;
  (this->crypto_metadata).ENCRYPTION_WITH_FOOTER_KEY =
       (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_0247d800;
  *(undefined ***)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY =
       &PTR__EncryptionWithColumnKey_0247d868;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_dataplus._M_p =
       (pointer)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata.field_2;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_string_length = 0;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.__isset;
  *p_Var1 = (_EncryptionWithColumnKey__isset)((byte)*p_Var1 & 0xfe);
  p_Var2 = &(this->crypto_metadata).__isset;
  *p_Var2 = (_ColumnCryptoMetaData__isset)((byte)*p_Var2 & 0xfc);
  (this->encrypted_column_metadata)._M_dataplus._M_p =
       (pointer)&(this->encrypted_column_metadata).field_2;
  (this->encrypted_column_metadata)._M_string_length = 0;
  (this->encrypted_column_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_ColumnChunk__isset)0x0;
  return;
}

Assistant:

ColumnChunk::ColumnChunk() noexcept
   : file_path(),
     file_offset(0LL),
     offset_index_offset(0),
     offset_index_length(0),
     column_index_offset(0),
     column_index_length(0),
     encrypted_column_metadata() {
}